

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UChar * __thiscall
icu_63::Normalizer2Impl::getDecomposition
          (Normalizer2Impl *this,UChar32 c,UChar *buffer,int32_t *length)

{
  undefined2 uVar1;
  ushort uVar2;
  int iVar3;
  int32_t iVar4;
  UChar *pUVar5;
  ushort *puVar6;
  int iVar7;
  
  if (c < (int)(uint)(ushort)this->minDecompNoCP) {
    pUVar5 = (UChar *)0x0;
  }
  else {
    uVar2 = getNorm16(this,c);
    if (uVar2 < this->minMaybeYes) {
      if (uVar2 < this->limitNoNo) {
        pUVar5 = (UChar *)0x0;
      }
      else {
        c = ((uint)(uVar2 >> 3) + c) - (uint)this->centerNoNoDelta;
        *length = 0;
        if ((uint)c < 0x10000) {
          *length = 1;
          *buffer = (UChar)c;
        }
        else {
          *length = 1;
          *buffer = (short)((uint)c >> 10) + L'ퟀ';
          *length = 2;
          buffer[1] = (UChar)c & 0x3ffU | 0xdc00;
        }
        uVar2 = getRawNorm16(this,c);
        pUVar5 = buffer;
      }
      if (this->minYesNo <= uVar2) {
        if ((uVar2 == this->minYesNo) || (uVar1 = this->minYesNoMappingsOnly, (uVar1 | 1) == uVar2))
        {
          iVar3 = c - 0xac00;
          iVar7 = (int)((ulong)((long)iVar3 * -0x6db6db6d) >> 0x20) + c + -0xac00;
          iVar7 = (iVar7 >> 4) - (iVar7 >> 0x1f);
          *buffer = ((short)((ulong)((long)iVar3 * 0x6f74ae27) >> 0x28) - (short)(iVar3 >> 0x1f)) +
                    L'ᄀ';
          buffer[1] = (short)iVar7 + (short)(iVar7 / 0x15) * -0x15 + L'ᅡ';
          iVar3 = iVar3 + iVar7 * -0x1c;
          if (iVar3 == 0) {
            iVar4 = 2;
          }
          else {
            buffer[2] = (short)iVar3 + L'ᆧ';
            iVar4 = 3;
          }
          *length = iVar4;
          pUVar5 = buffer;
        }
        else {
          puVar6 = (ushort *)((long)this->extraData + (ulong)(uVar2 & 0xfffe));
          pUVar5 = (UChar *)(puVar6 + 1);
          *length = *puVar6 & 0x1f;
        }
      }
    }
    else {
      pUVar5 = (UChar *)0x0;
    }
  }
  return pUVar5;
}

Assistant:

const UChar *
Normalizer2Impl::getDecomposition(UChar32 c, UChar buffer[4], int32_t &length) const {
    uint16_t norm16;
    if(c<minDecompNoCP || isMaybeOrNonZeroCC(norm16=getNorm16(c))) {
        // c does not decompose
        return nullptr;
    }
    const UChar *decomp = nullptr;
    if(isDecompNoAlgorithmic(norm16)) {
        // Maps to an isCompYesAndZeroCC.
        c=mapAlgorithmic(c, norm16);
        decomp=buffer;
        length=0;
        U16_APPEND_UNSAFE(buffer, length, c);
        // The mapping might decompose further.
        norm16 = getRawNorm16(c);
    }
    if (norm16 < minYesNo) {
        return decomp;
    } else if(isHangulLV(norm16) || isHangulLVT(norm16)) {
        // Hangul syllable: decompose algorithmically
        length=Hangul::decompose(c, buffer);
        return buffer;
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    length=*mapping&MAPPING_LENGTH_MASK;
    return (const UChar *)mapping+1;
}